

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O1

NodeRefPtr<4>
embree::sse2::BVHBuilderBinnedFastSpatialSAH::
build<embree::NodeRefPtr<4>,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set2,embree::sse2::CreateLeafSpatial<4,embree::TriangleMi<4>>,embree::sse2::TriangleSplitterFactory,embree::Scene::BuildProgressMonitorInterface>
          (undefined8 createAlloc,undefined8 *param_2,undefined8 param_3,undefined8 param_4,
          PrimRef *param_5,undefined8 param_6,plus<double> *param_7,undefined8 param_8)

{
  uint64_t uVar1;
  uint64_t uVar2;
  char cVar3;
  NodeRefPtr<4> NVar4;
  runtime_error *prVar5;
  float invA;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_double,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_std::plus<double>_>
  body;
  Heuristic heuristic;
  float f;
  task_group_context context;
  plus<double> local_17a;
  auto_partitioner local_179;
  PrimRef *local_178;
  undefined8 local_170;
  undefined8 *local_168;
  char local_160 [8];
  undefined8 local_158;
  double local_150;
  anon_class_8_1_a879a1ad local_148;
  double local_140;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_double,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_std::plus<double>_>
  local_138;
  PrimRef *local_118;
  undefined8 *local_110;
  plus<double> *local_108;
  undefined8 local_100;
  anon_class_16_2_ed117de8_conflict4 local_f8;
  anon_class_24_3_8ee612a4_conflict local_e8;
  blocked_range<unsigned_long> local_d0;
  task_group_context local_b8;
  
  local_110 = &local_100;
  local_148.prims = &local_178;
  local_108 = param_7;
  uVar1 = *(uint64_t *)(param_7 + 0x48);
  uVar2 = *(uint64_t *)(param_7 + 0x40);
  local_140 = 0.0;
  local_e8.func = &local_148;
  local_b8._12_2_ = 0x401;
  local_b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_b8.my_name = CUSTOM_CTX;
  local_178 = param_5;
  local_170 = createAlloc;
  local_168 = param_2;
  local_160 = (char  [8])param_6;
  local_158 = param_4;
  local_118 = param_5;
  local_100 = param_3;
  local_e8.identity = &local_140;
  local_e8.reduction = &local_17a;
  tbb::detail::r1::initialize(&local_b8);
  local_d0.my_begin = 0;
  local_d0.my_grainsize = 1;
  local_138.my_value = local_140;
  local_138.my_identity_element = &local_140;
  local_138.my_real_body = &local_f8;
  local_138.my_reduction = &local_17a;
  local_f8.reduction = &local_17a;
  local_f8.func = &local_e8;
  local_d0.my_end = uVar1 - uVar2;
  tbb::detail::d1::
  start_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_double,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_reduce.h:59:7),_std::plus<double>_>,_const_tbb::detail::d1::auto_partitioner>
  ::run(&local_d0,&local_138,&local_179,&local_b8);
  local_150 = local_138.my_value;
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_b8);
  if (cVar3 != '\0') {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"task cancelled");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_b8);
  local_f8.reduction = (plus<double> *)CONCAT44(local_f8.reduction._4_4_,0x41200000);
  local_140 = (double)CONCAT44(local_140._4_4_,1.0 / (float)local_150);
  uVar1 = *(uint64_t *)(param_7 + 0x48);
  uVar2 = *(uint64_t *)(param_7 + 0x40);
  local_138.my_identity_element = (double *)&local_178;
  local_138.my_reduction = param_7;
  local_b8._12_2_ = 0x401;
  local_b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_b8.my_name = CUSTOM_CTX;
  local_138.my_real_body = &local_f8;
  local_138.my_value = (double)&local_140;
  tbb::detail::r1::initialize(&local_b8);
  local_d0.my_begin = 0;
  local_d0.my_grainsize = 1;
  local_e8.identity = (double *)&local_138;
  local_d0.my_end = uVar1 - uVar2;
  tbb::detail::d1::
  start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
  ::run(&local_d0,(anon_class_8_1_898bcfc2 *)&local_e8,(auto_partitioner *)&local_148,&local_b8);
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_b8);
  if (cVar3 == '\0') {
    tbb::detail::r1::destroy(&local_b8);
    local_b8.padding._0_8_ = *(uint64_t *)(param_7 + 0x48) - *(uint64_t *)(param_7 + 0x40);
    local_b8.my_cpu_ctl_env = *(uint64_t *)param_7;
    local_b8._8_8_ = *(undefined8 *)(param_7 + 8);
    local_b8.field_6 = *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)(param_7 + 0x10);
    local_b8.my_context_list = *(context_list **)(param_7 + 0x18);
    local_b8.my_node.my_prev_node = *(intrusive_list_node **)(param_7 + 0x20);
    local_b8.my_node.my_next_node = *(intrusive_list_node **)(param_7 + 0x28);
    local_b8.my_exception._M_b._M_p._0_4_ = *(undefined4 *)(param_7 + 0x30);
    local_b8.my_exception._M_b._M_p._4_4_ = *(undefined4 *)(param_7 + 0x34);
    local_b8.my_itt_caller._0_4_ = *(undefined4 *)(param_7 + 0x38);
    local_b8.my_itt_caller._4_4_ = *(undefined4 *)(param_7 + 0x3c);
    local_b8.my_name = ALGORITHM;
    local_b8.padding[8] = local_160[0];
    local_b8.padding[9] = local_160[1];
    local_b8.padding[10] = local_160[2];
    local_b8.padding[0xb] = local_160[3];
    local_b8.padding[0xc] = local_160[4];
    local_b8.padding[0xd] = local_160[5];
    local_b8.padding[0xe] = local_160[6];
    local_b8.padding[0xf] = local_160[7];
    local_138.my_identity_element = (double *)*local_168;
    NVar4 = GeneralBVHBuilder::
            build<embree::NodeRefPtr<4>,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>,embree::sse2::PrimInfoExtRange,embree::PrimRef,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set2,embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMi<4>>>,embree::Scene::BuildProgressMonitorInterface>
                      (&local_118,local_178,&local_b8,local_170,&local_138,local_158,param_8);
    return (NodeRefPtr<4>)NVar4.ptr;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"task cancelled");
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static ReductionTy build(CreateAllocFunc createAlloc,
                                 CreateNodeFunc createNode,
                                 UpdateNodeFunc updateNode,
                                 const CreateLeafFunc& createLeaf,
                                 SplitPrimitiveFunc splitPrimitive,
                                 ProgressMonitor progressMonitor,
                                 PrimRef* prims,
                                 const size_t extSize,
                                 const PrimInfo& pinfo,
                                 const Settings& settings)
        {
          typedef HeuristicArraySpatialSAH<SplitPrimitiveFunc,PrimRef,NUM_OBJECT_BINS,NUM_SPATIAL_BINS> Heuristic;
          Heuristic heuristic(splitPrimitive,prims,pinfo);

          /* calculate total surface area */ // FIXME: this sum is not deterministic
          const float A = (float) parallel_reduce(size_t(0),pinfo.size(),0.0, [&] (const range<size_t>& r) -> double {

              double A = 0.0f;
              for (size_t i=r.begin(); i<r.end(); i++)
              {
                PrimRef& prim = prims[i];
                A += area(prim.bounds());
              }
              return A;
            },std::plus<double>());


          /* calculate maximum number of spatial splits per primitive */
          const unsigned int maxSplits = ((size_t)1 << RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)-1;
          const float f = 10.0f;

          const float invA = 1.0f / A;
          parallel_for( size_t(0), pinfo.size(), [&](const range<size_t>& r) {

              for (size_t i=r.begin(); i<r.end(); i++)
              {
                PrimRef& prim = prims[i];
                assert((prim.geomID() & SPLITS_MASK) == 0);
                // FIXME: is there a better general heuristic ?
                const float nf = ceilf(f*pinfo.size()*area(prim.bounds()) * invA);
                unsigned int n = 4+min((int)maxSplits-4, max(1, (int)(nf)));
                prim.lower.u |= n << (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS);
              }
            });

          return GeneralBVHBuilder::build<ReductionTy,Heuristic,Set,PrimRef>(
            heuristic,
            prims,
            PrimInfoExtRange(0,pinfo.size(),extSize,pinfo),
            createAlloc,
            createNode,
            updateNode,
            CreateLeafExt<ReductionTy,CreateLeafFunc>(createLeaf),
            progressMonitor,
            settings);
        }